

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCall.cpp
# Opt level: O2

void __thiscall ninx::parser::element::FunctionCall::set_parent(FunctionCall *this,Block *parent)

{
  pointer puVar1;
  FunctionCallArgument *pFVar2;
  unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
  *argument;
  pointer puVar3;
  
  (this->super_Statement).super_ASTElement.parent = parent;
  puVar1 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->arguments).
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pFVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::FunctionCallArgument,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionCallArgument_*,_std::default_delete<ninx::parser::element::FunctionCallArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionCallArgument_*,_false>.
             _M_head_impl;
    (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x20))(pFVar2,parent);
  }
  return;
}

Assistant:

void ninx::parser::element::FunctionCall::set_parent(ninx::parser::element::Block *parent) {
    ASTElement::set_parent(parent);

    for (auto &argument : arguments) {
        argument->set_parent(parent);
    }
}